

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

int __thiscall
kj::CapabilityStreamConnectionReceiver::accept
          (CapabilityStreamConnectionReceiver *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  undefined4 in_register_00000034;
  PropagateException local_29;
  Promise<kj::Own<kj::AsyncCapabilityStream>_> local_28;
  undefined8 local_18;
  CapabilityStreamConnectionReceiver *this_local;
  
  local_18 = CONCAT44(in_register_00000034,__fd);
  this_local = this;
  AsyncCapabilityStream::receiveStream((AsyncCapabilityStream *)&local_28);
  Promise<kj::Own<kj::AsyncCapabilityStream>>::
  then<kj::CapabilityStreamConnectionReceiver::accept()::__0,kj::_::PropagateException>
            ((Promise<kj::Own<kj::AsyncCapabilityStream>> *)this,(Type *)&local_28,&local_29);
  Promise<kj::Own<kj::AsyncCapabilityStream>_>::~Promise(&local_28);
  return (int)this;
}

Assistant:

Promise<Own<AsyncIoStream>> CapabilityStreamConnectionReceiver::accept() {
  return inner.receiveStream()
      .then([](Own<AsyncCapabilityStream>&& stream) -> Own<AsyncIoStream> {
    return kj::mv(stream);
  });
}